

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void __thiscall
bpwriter::format_int(bpwriter *this,char *p,size_t len,char *type_prefix,fmtopts *opts,int flags)

{
  int iVar1;
  size_t sVar2;
  int cnt;
  char ch;
  int iVar3;
  ulong uVar4;
  char cVar5;
  ulong uVar6;
  int i;
  int iVar7;
  ulong uVar8;
  char *local_48;
  
  uVar4 = 1;
  if (len != 0 && p != (char *)0x0) {
    uVar4 = len;
  }
  local_48 = "0";
  if (len != 0 && p != (char *)0x0) {
    local_48 = p;
  }
  cVar5 = *local_48;
  uVar6 = 0;
  do {
    uVar8 = uVar6;
    if (uVar4 == uVar8) break;
    uVar6 = uVar8 + 1;
  } while (cVar5 == '0');
  ch = opts->sign;
  iVar3 = (uint)(ch != '\0' && cVar5 != '-') + (int)uVar4;
  if (opts->group != L'\0') {
    iVar3 = iVar3 + (int)((~(ulong)(cVar5 == '-') + uVar4) / 3);
  }
  iVar7 = (int)uVar4 - (uint)(cVar5 == '-');
  if (((uVar8 < uVar4) && (type_prefix != (char *)0x0)) && (opts->pound != 0)) {
    sVar2 = strlen(type_prefix);
    iVar3 = iVar3 + (int)sVar2;
  }
  iVar1 = opts->prec - iVar7;
  if (iVar1 == 0 || opts->prec < iVar7) {
    iVar1 = 0;
  }
  cnt = opts->width - (iVar1 + iVar3);
  if (cnt == 0 || opts->width < iVar1 + iVar3) {
    cnt = 0;
  }
  if (opts->left_align == 0) {
    putwch(this,opts->pad,cnt);
    ch = opts->sign;
    cVar5 = *local_48;
  }
  if (ch == '\0') {
LAB_0022693b:
    uVar6 = uVar4;
    if (cVar5 != '-') goto LAB_0022695b;
  }
  else if (cVar5 != '-') {
    putch(this,ch);
    cVar5 = *local_48;
    goto LAB_0022693b;
  }
  local_48 = local_48 + 1;
  putch(this,'-');
  uVar6 = uVar4 - 1;
LAB_0022695b:
  if (((uVar8 < uVar4) && (type_prefix != (char *)0x0)) && (opts->pound != 0)) {
    puts(this,type_prefix);
  }
  for (; iVar7 < opts->prec; iVar7 = iVar7 + 1) {
    putch(this,'0');
  }
  uVar4 = uVar6;
  for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    if (((uVar4 % 3 == 0) && (opts->group != L'\0')) && ((int)uVar8 != 0)) {
      putwch(this,opts->group);
    }
    cVar5 = local_48[uVar8];
    iVar3 = (int)cVar5;
    if (iVar3 - 0x3aU < 0xfffffff6) {
      if ((flags & 2U) == 0) {
        iVar3 = tolower(iVar3);
        cVar5 = (char)iVar3;
      }
      else {
        iVar3 = toupper(iVar3);
        cVar5 = (char)iVar3;
      }
    }
    putch(this,cVar5);
    uVar4 = uVar4 - 1;
  }
  if (opts->left_align == 0) {
    return;
  }
  putwch(this,opts->pad,cnt);
  return;
}

Assistant:

void format_int(VMG_ const char *p, size_t len,
                    const char *type_prefix,
                    const fmtopts &opts, int flags)
    {
        /* if they're trying to pawn off an empty string on us, use "0" */
        if (p == 0 || len == 0)
            p = "0", len = 1;

        /* note if the value is all zeros */
        int zero = TRUE;
        const char *p2 = p;
        for (size_t i = 0 ; i < len ; ++i)
        {
            if (*p2 != '0')
            {
                zero = FALSE;
                break;
            }
        }

        /* 
         *   get the number of digits: assume that the whole thing is digits
         *   except for a leading minus sign 
         */
        int digits = len;
        if (*p == '-')
            --digits;

        /* 
         *   Figure the display width required.  Start with the length of the
         *   string.  If we the "sign" option is set and we don't have a "-"
         *   sign, add space for a "+" sign.  If the "group" option is set,
         *   add a comma for each group of three digits.  If the '#' flag is
         *   set, add the type prefix if the value is nonzero.  
         */
        int dispwid = len;
        if (opts.sign != '\0' && *p != '-')
            dispwid += 1;
        if (opts.group != 0)
            dispwid += ((len - (*p == '-' ? 1 : 0)) - 1)/3;
        if (opts.pound && type_prefix != 0 && !zero)
            dispwid += strlen(type_prefix);

        /*
         *   If there's a precision setting, it means that we're to add
         *   leading zeros to bring the number of digits up to the
         *   precision. 
         */
        if (digits < opts.prec)
            dispwid += opts.prec - digits;

        /* 
         *   Figure the amount of padding.  If there's an explicit width spec
         *   in the options, and the display width is less than the width
         *   spec, pad by the differene.  
         */
        int padcnt = (opts.width > dispwid ? opts.width - dispwid : 0);

        /* if they want right alignment, add padding characters before */
        if (!opts.left_align)
            putwch(opts.pad, padcnt);

        /* add the + sign if needed */
        if (opts.sign && *p != '-')
            putch(opts.sign);

        /* if there's a '-' sign, write it */
        if (*p == '-')
            putch(*p++), --len;

        /* add the type prefix */
        if (opts.pound && type_prefix != 0 && !zero)
            puts(type_prefix);

        /* add the leading zeros for the precision */
        for (int i = digits ; i < opts.prec ; ++i)
            putch('0');

        /* write the digits, adding grouping commas and converting case */
        for (int dig = 0 ; len != 0 ; ++p, --len, ++dig)
        {
            /* 
             *   if this isn't the first digit, and we have a multiple of
             *   three digits remaining, and we're using grouping, add the
             *   group comma 
             */
            if (opts.group != 0 && dig != 0 && len % 3 == 0)
                putwch(opts.group);

            /* write this character, converting case as needed */
            if (is_digit(*p))
                putch(*p);
            else if ((flags & FI_CAPS) != 0)
                putch((char)toupper(*p));
            else
                putch((char)tolower(*p));
        }

        /* if they want left alignment, add padding characters after */
        if (opts.left_align)
            putwch(opts.pad, padcnt);
    }